

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void __thiscall PosixRunWriter::~PosixRunWriter(PosixRunWriter *this)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(unaff_retaddr);
  if (!bVar1) {
    spdlog::error<char[46]>((char (*) [46])0x2100bc);
    std::terminate();
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

PosixRunWriter::~PosixRunWriter() {
    if (!buffer_.empty()) {
        // PosixRunWriter buffer not flushed, fatal error.
        spdlog::error("PosixRunWriter not flushed before destructing");
        std::terminate();
    }
}